

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void update_fp_status_x86_64(CPUX86State *env)

{
  ushort uVar1;
  int local_14;
  int rnd_type;
  CPUX86State *env_local;
  
  uVar1 = env->fpuc & 0xc00;
  if ((env->fpuc & 0xc00) != 0) {
    if (uVar1 == 0x400) {
      local_14 = 1;
      goto LAB_0051e0ab;
    }
    if (uVar1 == 0x800) {
      local_14 = 2;
      goto LAB_0051e0ab;
    }
    if (uVar1 == 0xc00) {
      local_14 = 3;
      goto LAB_0051e0ab;
    }
  }
  local_14 = 0;
LAB_0051e0ab:
  set_float_rounding_mode(local_14,&env->fp_status);
  if ((env->fpuc & 0x300) == 0) {
    local_14 = 0x20;
  }
  else if ((env->fpuc & 0x300) == 0x200) {
    local_14 = 0x40;
  }
  else {
    local_14 = 0x50;
  }
  set_floatx80_rounding_precision(local_14,&env->fp_status);
  return;
}

Assistant:

void update_fp_status(CPUX86State *env)
{
    int rnd_type;

    /* set rounding mode */
    switch (env->fpuc & FPU_RC_MASK) {
    default:
    case FPU_RC_NEAR:
        rnd_type = float_round_nearest_even;
        break;
    case FPU_RC_DOWN:
        rnd_type = float_round_down;
        break;
    case FPU_RC_UP:
        rnd_type = float_round_up;
        break;
    case FPU_RC_CHOP:
        rnd_type = float_round_to_zero;
        break;
    }
    set_float_rounding_mode(rnd_type, &env->fp_status);
    switch ((env->fpuc >> 8) & 3) {
    case 0:
        rnd_type = 32;
        break;
    case 2:
        rnd_type = 64;
        break;
    case 3:
    default:
        rnd_type = 80;
        break;
    }
    set_floatx80_rounding_precision(rnd_type, &env->fp_status);
}